

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

int __thiscall
CTPNConst::gen_code_asi
          (CTPNConst *this,int discard,int phase,tc_asitype_t typ,char *op,CTcPrsNode *param_5,
          int ignore_errors,int param_7,void **param_8)

{
  if (phase < 2 && ignore_errors == 0) {
    CTcTokenizer::log_error((uint)((typ & ~TC_ASI_MUL) == TC_ASI_PREINC) * 2 + 0x2afc,op);
  }
  return 0;
}

Assistant:

int CTPNConst::gen_code_asi(int discard, int phase,
                            tc_asitype_t typ, const char *op,
                            CTcPrsNode *, 
                            int ignore_errors, int, void **)
{
    /* 
     *   If ignoring errors, just indicate that we can't do the assignment.
     *   Also ignore errors on phase 2, since we'll already have generated an
     *   error during phase 1. 
     */
    if (ignore_errors || phase > 1)
        return FALSE;

    /* 
     *   We can't assign to a constant.  The parser will catch most errors of
     *   this type before we ever get here, but for expressions that resolve
     *   to global symbols (such as objects or functions), it can't know
     *   until code generation time that the expression won't be assignable. 
     */
    G_tok->log_error(typ == TC_ASI_PREINC || typ == TC_ASI_PREDEC
                     || typ == TC_ASI_POSTINC || typ == TC_ASI_POSTDEC
                     ? TCERR_INVALID_UNARY_LVALUE : TCERR_INVALID_LVALUE,
                     op);
    return FALSE;
}